

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

void __thiscall wasm::EffectAnalyzer::mergeIn(EffectAnalyzer *this,EffectAnalyzer *other)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  _Rb_tree_header *p_Var8;
  undefined1 auStack_48 [8];
  uint i;
  
  uVar1 = true;
  if (this->branchesOut == false) {
    uVar1 = other->branchesOut;
  }
  this->branchesOut = (bool)uVar1;
  bVar7 = other->calls;
  if (this->calls != false) {
    bVar7 = true;
  }
  this->calls = bVar7;
  uVar2 = true;
  if (this->readsMemory == false) {
    uVar2 = other->readsMemory;
  }
  this->readsMemory = (bool)uVar2;
  bVar7 = other->writesMemory;
  if (this->writesMemory != false) {
    bVar7 = true;
  }
  this->writesMemory = bVar7;
  bVar7 = other->readsTable;
  if (this->readsTable != false) {
    bVar7 = true;
  }
  this->readsTable = bVar7;
  bVar7 = other->writesTable;
  if (this->writesTable != false) {
    bVar7 = true;
  }
  this->writesTable = bVar7;
  uVar3 = true;
  if (this->readsMutableStruct == false) {
    uVar3 = other->readsMutableStruct;
  }
  this->readsMutableStruct = (bool)uVar3;
  bVar7 = other->writesStruct;
  if (this->writesStruct != false) {
    bVar7 = true;
  }
  this->writesStruct = bVar7;
  bVar7 = other->readsArray;
  if (this->readsArray != false) {
    bVar7 = true;
  }
  this->readsArray = bVar7;
  bVar7 = other->writesArray;
  if (this->writesArray != false) {
    bVar7 = true;
  }
  this->writesArray = bVar7;
  uVar4 = true;
  if (this->trap == false) {
    uVar4 = other->trap;
  }
  this->trap = (bool)uVar4;
  bVar7 = other->implicitTrap;
  if (this->implicitTrap != false) {
    bVar7 = true;
  }
  this->implicitTrap = bVar7;
  bVar7 = other->trapsNeverHappen;
  if (this->trapsNeverHappen != false) {
    bVar7 = true;
  }
  this->trapsNeverHappen = bVar7;
  bVar7 = other->isAtomic;
  if (this->isAtomic != false) {
    bVar7 = true;
  }
  this->isAtomic = bVar7;
  bVar7 = other->throws_;
  if (this->throws_ != false) {
    bVar7 = true;
  }
  this->throws_ = bVar7;
  uVar5 = true;
  if (this->danglingPop == false) {
    uVar5 = other->danglingPop;
  }
  this->danglingPop = (bool)uVar5;
  bVar7 = other->mayNotReturn;
  if (this->mayNotReturn != false) {
    bVar7 = true;
  }
  this->mayNotReturn = bVar7;
  p_Var6 = (other->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(other->localsRead)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    do {
      auStack_48._0_4_ = p_Var6[1]._M_color;
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&this->localsRead,(uint *)auStack_48);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  p_Var6 = (other->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(other->localsWritten)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    do {
      auStack_48._0_4_ = p_Var6[1]._M_color;
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&this->localsWritten,(uint *)auStack_48);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  p_Var6 = (other->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(other->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    do {
      auStack_48 = *(undefined1 (*) [8])(p_Var6 + 1);
      _i = p_Var6[1]._M_parent;
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&this->mutableGlobalsRead,(Name *)auStack_48);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  p_Var6 = (other->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(other->globalsWritten)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    do {
      auStack_48 = *(undefined1 (*) [8])(p_Var6 + 1);
      _i = p_Var6[1]._M_parent;
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&this->globalsWritten,(Name *)auStack_48);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  p_Var6 = (other->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(other->breakTargets)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    do {
      auStack_48 = *(undefined1 (*) [8])(p_Var6 + 1);
      _i = p_Var6[1]._M_parent;
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&this->breakTargets,(Name *)auStack_48);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  p_Var6 = (other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(other->delegateTargets)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    do {
      auStack_48 = *(undefined1 (*) [8])(p_Var6 + 1);
      _i = p_Var6[1]._M_parent;
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&this->delegateTargets,(Name *)auStack_48);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  return;
}

Assistant:

void mergeIn(const EffectAnalyzer& other) {
    branchesOut = branchesOut || other.branchesOut;
    calls = calls || other.calls;
    readsMemory = readsMemory || other.readsMemory;
    writesMemory = writesMemory || other.writesMemory;
    readsTable = readsTable || other.readsTable;
    writesTable = writesTable || other.writesTable;
    readsMutableStruct = readsMutableStruct || other.readsMutableStruct;
    writesStruct = writesStruct || other.writesStruct;
    readsArray = readsArray || other.readsArray;
    writesArray = writesArray || other.writesArray;
    trap = trap || other.trap;
    implicitTrap = implicitTrap || other.implicitTrap;
    trapsNeverHappen = trapsNeverHappen || other.trapsNeverHappen;
    isAtomic = isAtomic || other.isAtomic;
    throws_ = throws_ || other.throws_;
    danglingPop = danglingPop || other.danglingPop;
    mayNotReturn = mayNotReturn || other.mayNotReturn;
    for (auto i : other.localsRead) {
      localsRead.insert(i);
    }
    for (auto i : other.localsWritten) {
      localsWritten.insert(i);
    }
    for (auto i : other.mutableGlobalsRead) {
      mutableGlobalsRead.insert(i);
    }
    for (auto i : other.globalsWritten) {
      globalsWritten.insert(i);
    }
    for (auto i : other.breakTargets) {
      breakTargets.insert(i);
    }
    for (auto i : other.delegateTargets) {
      delegateTargets.insert(i);
    }
  }